

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape.h
# Opt level: O0

Persistence_landscape * __thiscall
Gudhi::Persistence_representations::operation_on_pair_of_landscapes<std::minus<double>>
          (Persistence_landscape *__return_storage_ptr__,Persistence_representations *this,
          Persistence_landscape *land1,Persistence_landscape *land2)

{
  double dVar1;
  pair<double,_double> p2;
  pair<double,_double> p1;
  pair<double,_double> p1_00;
  pair<double,_double> p2_00;
  pair<double,_double> p1_01;
  pair<double,_double> p2_01;
  pair<double,_double> p1_02;
  pair<double,_double> p2_02;
  pair<double,_double> p1_03;
  pair<double,_double> p2_03;
  pair<double,_double> p1_04;
  unsigned_long uVar2;
  unsigned_long *puVar3;
  ostream *poVar4;
  const_reference pvVar5;
  size_type sVar6;
  void *pvVar7;
  ulong uVar8;
  const_reference pvVar9;
  const_reference pvVar10;
  const_reference pvVar11;
  reference pvVar12;
  size_type sVar13;
  reference pvVar14;
  bool bVar15;
  pair<double,_double> pVar16;
  double local_360;
  double local_358;
  pair<double,_double> local_350;
  size_type local_340;
  size_t nr_1;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> lambda_n_2;
  size_type local_318;
  size_type local_310;
  size_type local_308;
  unsigned_long local_300;
  size_t i_3;
  size_type local_2f0;
  double local_2e8;
  double local_2e0;
  pair<double,_double> local_2d8;
  size_type local_2c8;
  size_t nr;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> lambda_n_1;
  size_type local_2a0;
  size_type local_298;
  size_type local_290;
  unsigned_long local_288;
  size_t i_2;
  size_type local_278;
  int local_270;
  int local_26c;
  pair<int,_int> local_268;
  pair<double,_double> local_260;
  double local_250;
  double local_248;
  value_type local_240;
  double local_230;
  double local_228;
  double local_220;
  value_type local_218;
  double local_208;
  double local_200;
  value_type local_1f8;
  double local_1e8;
  double dStack_1e0;
  double local_1d8;
  double dStack_1d0;
  double local_1c8;
  double local_1c0;
  value_type local_1b8;
  double local_1a8;
  double dStack_1a0;
  double local_198;
  double dStack_190;
  double local_180;
  double local_178;
  double dStack_170;
  double local_168;
  double dStack_160;
  double local_158;
  double dStack_150;
  double local_148;
  double dStack_140;
  double local_138;
  double dStack_130;
  double local_128;
  double dStack_120;
  double local_110;
  double local_108;
  double local_100;
  value_type local_f8;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  ulong local_c0;
  size_t q;
  size_t p;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> lambda_n;
  size_type local_90;
  unsigned_long local_88;
  size_t i_1;
  size_type local_78;
  unsigned_long local_70;
  size_t i;
  minus<double> oper;
  allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
  local_51;
  size_type local_50;
  size_type local_48;
  undefined1 local_40 [8];
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  land;
  bool operation_on_pair_of_landscapesDBG;
  Persistence_landscape *land2_local;
  Persistence_landscape *land1_local;
  Persistence_landscape *result;
  
  land.
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  land.
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  Persistence_landscape::Persistence_landscape(__return_storage_ptr__);
  local_48 = std::
             vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
             ::size((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                     *)this);
  local_50 = std::
             vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
             ::size(&land1->land);
  puVar3 = std::max<unsigned_long>(&local_48,&local_50);
  sVar6 = *puVar3;
  std::
  allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>::
  allocator(&local_51);
  std::
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ::vector((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
            *)local_40,sVar6,&local_51);
  std::
  allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>::
  ~allocator(&local_51);
  std::
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ::operator=(&__return_storage_ptr__->land,
              (vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               *)local_40);
  if ((land.
       super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
    local_70 = 0;
    while( true ) {
      uVar2 = local_70;
      local_78 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::size((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                         *)this);
      i_1 = std::
            vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
            ::size(&land1->land);
      puVar3 = std::min<unsigned_long>(&local_78,&i_1);
      if (uVar2 == *puVar3) break;
      poVar4 = std::operator<<((ostream *)&std::clog,"land1.land[");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_70);
      poVar4 = std::operator<<(poVar4,"].size() : ");
      pvVar5 = std::
               vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ::operator[]((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                             *)this,local_70);
      sVar6 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
              size(pvVar5);
      pvVar7 = (void *)std::ostream::operator<<(poVar4,sVar6);
      std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&std::clog,"land2.land[");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_70);
      poVar4 = std::operator<<(poVar4,"].size() : ");
      pvVar5 = std::
               vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ::operator[](&land1->land,local_70);
      sVar6 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
              size(pvVar5);
      pvVar7 = (void *)std::ostream::operator<<(poVar4,sVar6);
      std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
      local_70 = local_70 + 1;
    }
    getchar();
  }
  local_88 = 0;
  while( true ) {
    uVar2 = local_88;
    local_90 = std::
               vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ::size((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                       *)this);
    lambda_n.
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                  ::size(&land1->land);
    puVar3 = std::min<unsigned_long>
                       (&local_90,
                        (unsigned_long *)
                        &lambda_n.
                         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (uVar2 == *puVar3) break;
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::vector
              ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)&p)
    ;
    q = 0;
    local_c0 = 0;
    while( true ) {
      uVar8 = q + 1;
      pvVar5 = std::
               vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ::operator[]((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                             *)this,local_88);
      sVar6 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
              size(pvVar5);
      bVar15 = false;
      if (uVar8 < sVar6) {
        uVar8 = local_c0 + 1;
        pvVar5 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[](&land1->land,local_88);
        sVar6 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ::size(pvVar5);
        bVar15 = uVar8 < sVar6;
      }
      if (!bVar15) break;
      if ((land.
           super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
        poVar4 = std::operator<<((ostream *)&std::clog,"p : ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,q);
        std::operator<<(poVar4,"\n");
        poVar4 = std::operator<<((ostream *)&std::clog,"q : ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_c0);
        std::operator<<(poVar4,"\n");
        poVar4 = std::operator<<((ostream *)&std::clog,"land1.land.size() : ");
        sVar6 = std::
                vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                ::size((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                        *)this);
        pvVar7 = (void *)std::ostream::operator<<(poVar4,sVar6);
        std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<((ostream *)&std::clog,"land2.land.size() : ");
        sVar6 = std::
                vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                ::size(&land1->land);
        pvVar7 = (void *)std::ostream::operator<<(poVar4,sVar6);
        std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<((ostream *)&std::clog,"land1.land[");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_88);
        poVar4 = std::operator<<(poVar4,"].size() : ");
        pvVar5 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[]((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                               *)this,local_88);
        sVar6 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ::size(pvVar5);
        pvVar7 = (void *)std::ostream::operator<<(poVar4,sVar6);
        std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<((ostream *)&std::clog,"land2.land[");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_88);
        poVar4 = std::operator<<(poVar4,"].size() : ");
        pvVar5 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[](&land1->land,local_88);
        sVar6 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ::size(pvVar5);
        pvVar7 = (void *)std::ostream::operator<<(poVar4,sVar6);
        std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<((ostream *)&std::clog,"land1.land[i][p].first : ");
        pvVar5 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[]((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                               *)this,local_88);
        pvVar10 = std::
                  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                  operator[](pvVar5,q);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,pvVar10->first);
        std::operator<<(poVar4,"\n");
        poVar4 = std::operator<<((ostream *)&std::clog,"land2.land[i][q].first : ");
        pvVar5 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[](&land1->land,local_88);
        pvVar10 = std::
                  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                  operator[](pvVar5,local_c0);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,pvVar10->first);
        std::operator<<(poVar4,"\n");
      }
      pvVar5 = std::
               vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ::operator[]((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                             *)this,local_88);
      pvVar10 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ::operator[](pvVar5,q);
      dVar1 = pvVar10->first;
      pvVar5 = std::
               vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ::operator[](&land1->land,local_88);
      pvVar10 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ::operator[](pvVar5,local_c0);
      if (pvVar10->first <= dVar1) {
        pvVar5 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[]((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                               *)this,local_88);
        pvVar10 = std::
                  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                  operator[](pvVar5,q);
        dVar1 = pvVar10->first;
        pvVar5 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[](&land1->land,local_88);
        pvVar10 = std::
                  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                  operator[](pvVar5,local_c0);
        if (dVar1 < pvVar10->first || dVar1 == pvVar10->first) {
          pvVar5 = std::
                   vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                   ::operator[]((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                                 *)this,local_88);
          pvVar10 = std::
                    vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                    operator[](pvVar5,q);
          dVar1 = pvVar10->first;
          pvVar5 = std::
                   vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                   ::operator[](&land1->land,local_88);
          pvVar10 = std::
                    vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                    operator[](pvVar5,local_c0);
          if ((dVar1 == pvVar10->first) && (!NAN(dVar1) && !NAN(pvVar10->first))) {
            if ((land.
                 super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
              std::operator<<((ostream *)&std::clog,"Third \n");
            }
            pvVar5 = std::
                     vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                     ::operator[](&land1->land,local_88);
            pvVar10 = std::
                      vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ::operator[](pvVar5,local_c0);
            pvVar5 = std::
                     vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                     ::operator[]((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                                   *)this,local_88);
            pvVar11 = std::
                      vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ::operator[](pvVar5,q);
            pvVar5 = std::
                     vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                     ::operator[](&land1->land,local_88);
            pvVar9 = std::
                     vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     ::operator[](pvVar5,local_c0);
            local_200 = std::minus<double>::operator()
                                  ((minus<double> *)((long)&i + 3),&pvVar11->second,&pvVar9->second)
            ;
            pVar16 = std::make_pair<double_const&,double>(&pvVar10->first,&local_200);
            local_1f8.second = pVar16.second;
            local_1f8.first = pVar16.first;
            std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
            push_back((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       *)&p,&local_1f8);
            q = q + 1;
            local_c0 = local_c0 + 1;
          }
          if ((land.
               super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
            std::operator<<((ostream *)&std::clog,"Next iteration \n");
          }
        }
        else {
          if ((land.
               super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
            std::operator<<((ostream *)&std::clog,"Second \n");
            poVar4 = std::operator<<((ostream *)&std::clog,"function_value(");
            pvVar5 = std::
                     vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                     ::operator[]((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                                   *)this,local_88);
            pvVar10 = std::
                      vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ::operator[](pvVar5,q - 1);
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,pvVar10->first);
            poVar4 = std::operator<<(poVar4," ");
            pvVar5 = std::
                     vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                     ::operator[]((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                                   *)this,local_88);
            pvVar10 = std::
                      vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ::operator[](pvVar5,q - 1);
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,pvVar10->second);
            poVar4 = std::operator<<(poVar4," ,");
            pvVar5 = std::
                     vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                     ::operator[]((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                                   *)this,local_88);
            pvVar10 = std::
                      vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ::operator[](pvVar5,q);
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,pvVar10->first);
            poVar4 = std::operator<<(poVar4," ");
            pvVar5 = std::
                     vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                     ::operator[]((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                                   *)this,local_88);
            pvVar10 = std::
                      vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ::operator[](pvVar5,q);
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,pvVar10->second);
            poVar4 = std::operator<<(poVar4,", ");
            pvVar5 = std::
                     vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                     ::operator[](&land1->land,local_88);
            pvVar10 = std::
                      vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ::operator[](pvVar5,local_c0);
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,pvVar10->first);
            poVar4 = std::operator<<(poVar4," ) : ");
            pvVar5 = std::
                     vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                     ::operator[]((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                                   *)this,local_88);
            pvVar10 = std::
                      vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ::operator[](pvVar5,q - 1);
            local_148 = pvVar10->first;
            dStack_140 = pvVar10->second;
            pvVar5 = std::
                     vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                     ::operator[]((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                                   *)this,local_88);
            pvVar10 = std::
                      vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ::operator[](pvVar5,q - 1);
            local_158 = pvVar10->first;
            dStack_150 = pvVar10->second;
            pvVar5 = std::
                     vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                     ::operator[](&land1->land,local_88);
            pvVar10 = std::
                      vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ::operator[](pvVar5,local_c0);
            p1_02.second = dStack_140;
            p1_02.first = local_148;
            p2_01.second = dStack_150;
            p2_01.first = local_158;
            dVar1 = function_value(p1_02,p2_01,pvVar10->first);
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar1);
            std::operator<<(poVar4,"\n");
            poVar4 = std::operator<<((ostream *)&std::clog,"oper( ");
            pvVar5 = std::
                     vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                     ::operator[]((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                                   *)this,local_88);
            pvVar10 = std::
                      vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ::operator[](pvVar5,q);
            local_168 = pvVar10->first;
            dStack_160 = pvVar10->second;
            pvVar5 = std::
                     vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                     ::operator[]((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                                   *)this,local_88);
            pvVar10 = std::
                      vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ::operator[](pvVar5,q - 1);
            local_178 = pvVar10->first;
            dStack_170 = pvVar10->second;
            pvVar5 = std::
                     vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                     ::operator[](&land1->land,local_88);
            pvVar10 = std::
                      vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ::operator[](pvVar5,local_c0);
            p1_01.second = dStack_160;
            p1_01.first = local_168;
            p2_00.second = dStack_170;
            p2_00.first = local_178;
            dVar1 = function_value(p1_01,p2_00,pvVar10->first);
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar1);
            poVar4 = std::operator<<(poVar4,",");
            pvVar5 = std::
                     vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                     ::operator[](&land1->land,local_88);
            pvVar10 = std::
                      vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ::operator[](pvVar5,local_c0);
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,pvVar10->second);
            poVar4 = std::operator<<(poVar4," : ");
            pvVar5 = std::
                     vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                     ::operator[](&land1->land,local_88);
            pvVar10 = std::
                      vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ::operator[](pvVar5,local_c0);
            pvVar5 = std::
                     vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                     ::operator[]((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                                   *)this,local_88);
            pvVar11 = std::
                      vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ::operator[](pvVar5,q);
            local_198 = pvVar11->first;
            dStack_190 = pvVar11->second;
            pvVar5 = std::
                     vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                     ::operator[]((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                                   *)this,local_88);
            pvVar11 = std::
                      vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ::operator[](pvVar5,q - 1);
            local_1a8 = pvVar11->first;
            dStack_1a0 = pvVar11->second;
            pvVar5 = std::
                     vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                     ::operator[](&land1->land,local_88);
            pvVar11 = std::
                      vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ::operator[](pvVar5,local_c0);
            p1_00.second = dStack_190;
            p1_00.first = local_198;
            pVar16.second = dStack_1a0;
            pVar16.first = local_1a8;
            local_180 = function_value(p1_00,pVar16,pvVar11->first);
            dVar1 = std::minus<double>::operator()
                              ((minus<double> *)((long)&i + 3),&pvVar10->second,&local_180);
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar1);
            std::operator<<(poVar4,"\n");
          }
          pvVar5 = std::
                   vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                   ::operator[](&land1->land,local_88);
          pvVar10 = std::
                    vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                    operator[](pvVar5,local_c0);
          pvVar5 = std::
                   vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                   ::operator[]((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                                 *)this,local_88);
          pvVar11 = std::
                    vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                    operator[](pvVar5,q);
          local_1d8 = pvVar11->first;
          dStack_1d0 = pvVar11->second;
          pvVar5 = std::
                   vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                   ::operator[]((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                                 *)this,local_88);
          pvVar11 = std::
                    vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                    operator[](pvVar5,q - 1);
          local_1e8 = pvVar11->first;
          dStack_1e0 = pvVar11->second;
          pvVar5 = std::
                   vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                   ::operator[](&land1->land,local_88);
          pvVar11 = std::
                    vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                    operator[](pvVar5,local_c0);
          p1.second = dStack_1d0;
          p1.first = local_1d8;
          p2.second = dStack_1e0;
          p2.first = local_1e8;
          local_1c8 = function_value(p1,p2,pvVar11->first);
          pvVar5 = std::
                   vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                   ::operator[](&land1->land,local_88);
          pvVar11 = std::
                    vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                    operator[](pvVar5,local_c0);
          local_1c0 = std::minus<double>::operator()
                                ((minus<double> *)((long)&i + 3),&local_1c8,&pvVar11->second);
          pVar16 = std::make_pair<double_const&,double>(&pvVar10->first,&local_1c0);
          local_1b8.second = pVar16.second;
          local_1b8.first = pVar16.first;
          std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
          push_back((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     *)&p,&local_1b8);
          local_c0 = local_c0 + 1;
        }
      }
      else {
        if ((land.
             super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
          std::operator<<((ostream *)&std::clog,"first \n");
          poVar4 = std::operator<<((ostream *)&std::clog,
                                   " function_value(land2.land[i][q-1],land2.land[i][q],land1.land[i][p].first) : "
                                  );
          pvVar5 = std::
                   vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                   ::operator[](&land1->land,local_88);
          pvVar10 = std::
                    vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                    operator[](pvVar5,local_c0 - 1);
          local_d8 = pvVar10->first;
          dStack_d0 = pvVar10->second;
          pvVar5 = std::
                   vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                   ::operator[](&land1->land,local_88);
          pvVar10 = std::
                    vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                    operator[](pvVar5,local_c0);
          local_e8 = pvVar10->first;
          dStack_e0 = pvVar10->second;
          pvVar5 = std::
                   vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                   ::operator[]((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                                 *)this,local_88);
          pvVar10 = std::
                    vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                    operator[](pvVar5,q);
          p1_04.second = dStack_d0;
          p1_04.first = local_d8;
          p2_03.second = dStack_e0;
          p2_03.first = local_e8;
          dVar1 = function_value(p1_04,p2_03,pvVar10->first);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar1);
          std::operator<<(poVar4,"\n");
        }
        pvVar5 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[]((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                               *)this,local_88);
        pvVar10 = std::
                  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                  operator[](pvVar5,q);
        pvVar5 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[]((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                               *)this,local_88);
        pvVar11 = std::
                  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                  operator[](pvVar5,q);
        local_108 = pvVar11->second;
        pvVar5 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[](&land1->land,local_88);
        pvVar11 = std::
                  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                  operator[](pvVar5,local_c0 - 1);
        local_128 = pvVar11->first;
        dStack_120 = pvVar11->second;
        pvVar5 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[](&land1->land,local_88);
        pvVar11 = std::
                  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                  operator[](pvVar5,local_c0);
        local_138 = pvVar11->first;
        dStack_130 = pvVar11->second;
        pvVar5 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[]((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                               *)this,local_88);
        pvVar11 = std::
                  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                  operator[](pvVar5,q);
        p1_03.second = dStack_120;
        p1_03.first = local_128;
        p2_02.second = dStack_130;
        p2_02.first = local_138;
        local_110 = function_value(p1_03,p2_02,pvVar11->first);
        local_100 = std::minus<double>::operator()
                              ((minus<double> *)((long)&i + 3),&local_108,&local_110);
        pVar16 = std::make_pair<double_const&,double>(&pvVar10->first,&local_100);
        local_f8.second = pVar16.second;
        local_f8.first = pVar16.first;
        std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
        push_back((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
                  &p,&local_f8);
        q = q + 1;
      }
    }
    while( true ) {
      uVar8 = q + 1;
      pvVar5 = std::
               vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ::operator[]((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                             *)this,local_88);
      sVar6 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
              size(pvVar5);
      bVar15 = false;
      if (uVar8 < sVar6) {
        uVar8 = local_c0 + 1;
        pvVar5 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[](&land1->land,local_88);
        sVar6 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ::size(pvVar5);
        bVar15 = sVar6 <= uVar8;
      }
      if (!bVar15) break;
      if ((land.
           super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
        poVar4 = std::operator<<((ostream *)&std::clog,"New point : ");
        pvVar5 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[]((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                               *)this,local_88);
        pvVar10 = std::
                  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                  operator[](pvVar5,q);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,pvVar10->first);
        poVar4 = std::operator<<(poVar4,"  oper(land1.land[i][p].second,0) : ");
        pvVar5 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[]((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                               *)this,local_88);
        pvVar10 = std::
                  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                  operator[](pvVar5,q);
        local_208 = 0.0;
        dVar1 = std::minus<double>::operator()
                          ((minus<double> *)((long)&i + 3),&pvVar10->second,&local_208);
        pvVar7 = (void *)std::ostream::operator<<(poVar4,dVar1);
        std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
      }
      pvVar5 = std::
               vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ::operator[]((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                             *)this,local_88);
      pvVar10 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ::operator[](pvVar5,q);
      pvVar5 = std::
               vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ::operator[]((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                             *)this,local_88);
      pvVar11 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ::operator[](pvVar5,q);
      local_228 = 0.0;
      local_220 = std::minus<double>::operator()
                            ((minus<double> *)((long)&i + 3),&pvVar11->second,&local_228);
      pVar16 = std::make_pair<double_const&,double>(&pvVar10->first,&local_220);
      local_218.second = pVar16.second;
      local_218.first = pVar16.first;
      std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::push_back
                ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
                 &p,&local_218);
      q = q + 1;
    }
    while( true ) {
      uVar8 = q + 1;
      pvVar5 = std::
               vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ::operator[]((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                             *)this,local_88);
      sVar6 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
              size(pvVar5);
      bVar15 = false;
      if (sVar6 <= uVar8) {
        uVar8 = local_c0 + 1;
        pvVar5 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[](&land1->land,local_88);
        sVar6 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ::size(pvVar5);
        bVar15 = uVar8 < sVar6;
      }
      if (!bVar15) break;
      if ((land.
           super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
        poVar4 = std::operator<<((ostream *)&std::clog,"New point : ");
        pvVar5 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[](&land1->land,local_88);
        pvVar10 = std::
                  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                  operator[](pvVar5,local_c0);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,pvVar10->first);
        poVar4 = std::operator<<(poVar4," oper(0,land2.land[i][q].second) : ");
        local_230 = 0.0;
        pvVar5 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[](&land1->land,local_88);
        pvVar10 = std::
                  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                  operator[](pvVar5,local_c0);
        dVar1 = std::minus<double>::operator()
                          ((minus<double> *)((long)&i + 3),&local_230,&pvVar10->second);
        pvVar7 = (void *)std::ostream::operator<<(poVar4,dVar1);
        std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
      }
      pvVar5 = std::
               vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ::operator[](&land1->land,local_88);
      pvVar10 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ::operator[](pvVar5,local_c0);
      local_250 = 0.0;
      pvVar5 = std::
               vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ::operator[](&land1->land,local_88);
      pvVar11 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ::operator[](pvVar5,local_c0);
      local_248 = std::minus<double>::operator()
                            ((minus<double> *)((long)&i + 3),&local_250,&pvVar11->second);
      pVar16 = std::make_pair<double_const&,double>(&pvVar10->first,&local_248);
      local_240.second = pVar16.second;
      local_240.first = pVar16.first;
      std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::push_back
                ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
                 &p,&local_240);
      local_c0 = local_c0 + 1;
    }
    local_26c = std::numeric_limits<int>::max();
    local_270 = 0;
    local_268 = std::make_pair<int,int>(&local_26c,&local_270);
    std::pair<double,_double>::pair<int,_int,_true>(&local_260,&local_268);
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::push_back
              ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)&p,
               &local_260);
    pvVar12 = std::
              vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
              ::operator[](&__return_storage_ptr__->land,local_88);
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::swap
              (pvVar12,(vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                        *)&p);
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::~vector
              ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)&p)
    ;
    local_88 = local_88 + 1;
  }
  sVar6 = std::
          vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
          ::size((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                  *)this);
  local_278 = std::
              vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
              ::size((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                      *)this);
  i_2 = std::
        vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
        ::size(&land1->land);
  puVar3 = std::min<unsigned_long>(&local_278,&i_2);
  if (*puVar3 < sVar6) {
    if ((land.
         super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
      poVar4 = std::operator<<((ostream *)&std::clog,
                               "land1.land.size() > std::min( land1.land.size() , land2.land.size() )"
                              );
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    local_290 = std::
                vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                ::size((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                        *)this);
    local_298 = std::
                vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                ::size(&land1->land);
    puVar3 = std::min<unsigned_long>(&local_290,&local_298);
    local_288 = *puVar3;
    while( true ) {
      uVar2 = local_288;
      local_2a0 = std::
                  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                  ::size((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                          *)this);
      lambda_n_1.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                    ::size(&land1->land);
      puVar3 = std::max<unsigned_long>
                         (&local_2a0,
                          (unsigned_long *)
                          &lambda_n_1.
                           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (uVar2 == *puVar3) break;
      pvVar5 = std::
               vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ::operator[]((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                             *)this,local_288);
      std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::vector
                ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
                 &nr,pvVar5);
      local_2c8 = 0;
      while( true ) {
        sVar6 = local_2c8;
        pvVar5 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[]((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                               *)this,local_288);
        sVar13 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::size(pvVar5);
        if (sVar6 == sVar13) break;
        pvVar5 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[]((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                               *)this,local_288);
        pvVar10 = std::
                  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                  operator[](pvVar5,local_2c8);
        pvVar5 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[]((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                               *)this,local_288);
        pvVar11 = std::
                  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                  operator[](pvVar5,local_2c8);
        local_2e8 = 0.0;
        local_2e0 = std::minus<double>::operator()
                              ((minus<double> *)((long)&i + 3),&pvVar11->second,&local_2e8);
        pVar16 = std::make_pair<double_const&,double>(&pvVar10->first,&local_2e0);
        local_2d8.second = pVar16.second;
        local_2d8.first = pVar16.first;
        pvVar14 = std::
                  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                  operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              *)&nr,local_2c8);
        std::pair<double,_double>::operator=(pvVar14,&local_2d8);
        local_2c8 = local_2c8 + 1;
      }
      pvVar12 = std::
                vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                ::operator[](&__return_storage_ptr__->land,local_288);
      std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::swap
                (pvVar12,(vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          *)&nr);
      std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::~vector
                ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
                 &nr);
      local_288 = local_288 + 1;
    }
  }
  sVar6 = std::
          vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
          ::size(&land1->land);
  local_2f0 = std::
              vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
              ::size((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                      *)this);
  i_3 = std::
        vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
        ::size(&land1->land);
  puVar3 = std::min<unsigned_long>(&local_2f0,&i_3);
  if (*puVar3 < sVar6) {
    if ((land.
         super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
      poVar4 = std::operator<<((ostream *)&std::clog,
                               "( land2.land.size() > std::min( land1.land.size() , land2.land.size() ) ) "
                              );
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    local_308 = std::
                vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                ::size((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                        *)this);
    local_310 = std::
                vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                ::size(&land1->land);
    puVar3 = std::min<unsigned_long>(&local_308,&local_310);
    local_300 = *puVar3;
    while( true ) {
      uVar2 = local_300;
      local_318 = std::
                  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                  ::size((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                          *)this);
      lambda_n_2.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                    ::size(&land1->land);
      puVar3 = std::max<unsigned_long>
                         (&local_318,
                          (unsigned_long *)
                          &lambda_n_2.
                           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (uVar2 == *puVar3) break;
      pvVar5 = std::
               vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ::operator[](&land1->land,local_300);
      std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::vector
                ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
                 &nr_1,pvVar5);
      local_340 = 0;
      while( true ) {
        sVar6 = local_340;
        pvVar5 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[](&land1->land,local_300);
        sVar13 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::size(pvVar5);
        if (sVar6 == sVar13) break;
        pvVar5 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[](&land1->land,local_300);
        pvVar10 = std::
                  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                  operator[](pvVar5,local_340);
        local_360 = 0.0;
        pvVar5 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[](&land1->land,local_300);
        pvVar11 = std::
                  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                  operator[](pvVar5,local_340);
        local_358 = std::minus<double>::operator()
                              ((minus<double> *)((long)&i + 3),&local_360,&pvVar11->second);
        pVar16 = std::make_pair<double_const&,double>(&pvVar10->first,&local_358);
        local_350.second = pVar16.second;
        local_350.first = pVar16.first;
        pvVar14 = std::
                  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                  operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              *)&nr_1,local_340);
        std::pair<double,_double>::operator=(pvVar14,&local_350);
        local_340 = local_340 + 1;
      }
      pvVar12 = std::
                vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                ::operator[](&__return_storage_ptr__->land,local_300);
      std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::swap
                (pvVar12,(vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          *)&nr_1);
      std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::~vector
                ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
                 &nr_1);
      local_300 = local_300 + 1;
    }
  }
  if ((land.
       super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
    std::operator<<((ostream *)&std::clog,"operation_on_pair_of_landscapes END\n");
    std::istream::ignore();
  }
  land.
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  std::
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ::~vector((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
             *)local_40);
  if ((land.
       super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1) == 0) {
    Persistence_landscape::~Persistence_landscape(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Persistence_landscape operation_on_pair_of_landscapes(const Persistence_landscape& land1,
                                                      const Persistence_landscape& land2) {
  bool operation_on_pair_of_landscapesDBG = false;
  if (operation_on_pair_of_landscapesDBG) {
    std::clog << "operation_on_pair_of_landscapes\n";
    std::cin.ignore();
  }
  Persistence_landscape result;
  std::vector<std::vector<std::pair<double, double> > > land(std::max(land1.land.size(), land2.land.size()));
  result.land = land;
  T oper;

  if (operation_on_pair_of_landscapesDBG) {
    for (size_t i = 0; i != std::min(land1.land.size(), land2.land.size()); ++i) {
      std::clog << "land1.land[" << i << "].size() : " << land1.land[i].size() << std::endl;
      std::clog << "land2.land[" << i << "].size() : " << land2.land[i].size() << std::endl;
    }
    getchar();
  }

  for (size_t i = 0; i != std::min(land1.land.size(), land2.land.size()); ++i) {
    std::vector<std::pair<double, double> > lambda_n;
    size_t p = 0;
    size_t q = 0;
    while ((p + 1 < land1.land[i].size()) && (q + 1 < land2.land[i].size())) {
      if (operation_on_pair_of_landscapesDBG) {
        std::clog << "p : " << p << "\n";
        std::clog << "q : " << q << "\n";
        std::clog << "land1.land.size() : " << land1.land.size() << std::endl;
        std::clog << "land2.land.size() : " << land2.land.size() << std::endl;
        std::clog << "land1.land[" << i << "].size() : " << land1.land[i].size() << std::endl;
        std::clog << "land2.land[" << i << "].size() : " << land2.land[i].size() << std::endl;
        std::clog << "land1.land[i][p].first : " << land1.land[i][p].first << "\n";
        std::clog << "land2.land[i][q].first : " << land2.land[i][q].first << "\n";
      }

      if (land1.land[i][p].first < land2.land[i][q].first) {
        if (operation_on_pair_of_landscapesDBG) {
          std::clog << "first \n";
          std::clog << " function_value(land2.land[i][q-1],land2.land[i][q],land1.land[i][p].first) : "
                    << function_value(land2.land[i][q - 1], land2.land[i][q], land1.land[i][p].first) << "\n";
        }
        lambda_n.push_back(
            std::make_pair(land1.land[i][p].first,
                           oper(static_cast<double>(land1.land[i][p].second),
                                function_value(land2.land[i][q - 1], land2.land[i][q], land1.land[i][p].first))));
        ++p;
        continue;
      }
      if (land1.land[i][p].first > land2.land[i][q].first) {
        if (operation_on_pair_of_landscapesDBG) {
          std::clog << "Second \n";
          std::clog << "function_value(" << land1.land[i][p - 1].first << " " << land1.land[i][p - 1].second << " ,"
                    << land1.land[i][p].first << " " << land1.land[i][p].second << ", " << land2.land[i][q].first
                    << " ) : " << function_value(land1.land[i][p - 1], land1.land[i][p - 1], land2.land[i][q].first)
                    << "\n";
          std::clog << "oper( " << function_value(land1.land[i][p], land1.land[i][p - 1], land2.land[i][q].first) << ","
                    << land2.land[i][q].second << " : "
                    << oper(land2.land[i][q].second,
                            function_value(land1.land[i][p], land1.land[i][p - 1], land2.land[i][q].first))
                    << "\n";
        }
        lambda_n.push_back(std::make_pair(
            land2.land[i][q].first, oper(function_value(land1.land[i][p], land1.land[i][p - 1], land2.land[i][q].first),
                                         land2.land[i][q].second)));
        ++q;
        continue;
      }
      if (land1.land[i][p].first == land2.land[i][q].first) {
        if (operation_on_pair_of_landscapesDBG) std::clog << "Third \n";
        lambda_n.push_back(
            std::make_pair(land2.land[i][q].first, oper(land1.land[i][p].second, land2.land[i][q].second)));
        ++p;
        ++q;
      }
      if (operation_on_pair_of_landscapesDBG) {
        std::clog << "Next iteration \n";
      }
    }
    while ((p + 1 < land1.land[i].size()) && (q + 1 >= land2.land[i].size())) {
      if (operation_on_pair_of_landscapesDBG) {
        std::clog << "New point : " << land1.land[i][p].first
                  << "  oper(land1.land[i][p].second,0) : " << oper(land1.land[i][p].second, 0) << std::endl;
      }
      lambda_n.push_back(std::make_pair(land1.land[i][p].first, oper(land1.land[i][p].second, 0)));
      ++p;
    }
    while ((p + 1 >= land1.land[i].size()) && (q + 1 < land2.land[i].size())) {
      if (operation_on_pair_of_landscapesDBG) {
        std::clog << "New point : " << land2.land[i][q].first
                  << " oper(0,land2.land[i][q].second) : " << oper(0, land2.land[i][q].second) << std::endl;
      }
      lambda_n.push_back(std::make_pair(land2.land[i][q].first, oper(0, land2.land[i][q].second)));
      ++q;
    }
    lambda_n.push_back(std::make_pair(std::numeric_limits<int>::max(), 0));
    // CHANGE
    // result.land[i] = lambda_n;
    result.land[i].swap(lambda_n);
  }
  if (land1.land.size() > std::min(land1.land.size(), land2.land.size())) {
    if (operation_on_pair_of_landscapesDBG) {
      std::clog << "land1.land.size() > std::min( land1.land.size() , land2.land.size() )" << std::endl;
    }
    for (size_t i = std::min(land1.land.size(), land2.land.size()); i != std::max(land1.land.size(), land2.land.size());
         ++i) {
      std::vector<std::pair<double, double> > lambda_n(land1.land[i]);
      for (size_t nr = 0; nr != land1.land[i].size(); ++nr) {
        lambda_n[nr] = std::make_pair(land1.land[i][nr].first, oper(land1.land[i][nr].second, 0));
      }
      // CHANGE
      // result.land[i] = lambda_n;
      result.land[i].swap(lambda_n);
    }
  }
  if (land2.land.size() > std::min(land1.land.size(), land2.land.size())) {
    if (operation_on_pair_of_landscapesDBG) {
      std::clog << "( land2.land.size() > std::min( land1.land.size() , land2.land.size() ) ) " << std::endl;
    }
    for (size_t i = std::min(land1.land.size(), land2.land.size()); i != std::max(land1.land.size(), land2.land.size());
         ++i) {
      std::vector<std::pair<double, double> > lambda_n(land2.land[i]);
      for (size_t nr = 0; nr != land2.land[i].size(); ++nr) {
        lambda_n[nr] = std::make_pair(land2.land[i][nr].first, oper(0, land2.land[i][nr].second));
      }
      // CHANGE
      // result.land[i] = lambda_n;
      result.land[i].swap(lambda_n);
    }
  }
  if (operation_on_pair_of_landscapesDBG) {
    std::clog << "operation_on_pair_of_landscapes END\n";
    std::cin.ignore();
  }
  return result;
}